

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::compGrad(MLNodeLaplacian *this,int amrlev,MultiFab *grad,MultiFab *sol)

{
  double dVar1;
  bool bVar2;
  FabType FVar3;
  Geometry *this_00;
  pointer pFVar4;
  MFIter *this_01;
  FabArray<amrex::EBCellFlagFab> *fabarray_;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_double> *intgarr;
  Array4<const_double> *vfracarr;
  FabType type;
  bool regular;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *solarr;
  Array4<double> *garr;
  Box *bx;
  MFIter mfi;
  MultiFab *intg;
  MultiFab *vfrac;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  GpuArray<double,_3U> dxinv;
  Real sigma;
  Real facz;
  Real facy;
  Real facx;
  Real dpp_xyz;
  Real dpp_yz;
  Real dpp_xz;
  Real dpp_xy;
  Real dpdz;
  Real dpdy;
  Real dpdx;
  size_type in_stack_ffffffffffffefc8;
  PCData<amrex::FArrayBox> *mfi_00;
  FabArray<amrex::EBCellFlagFab> *in_stack_ffffffffffffefd0;
  FabArray<amrex::FArrayBox> *this_02;
  undefined1 do_tiling_;
  int local_fe4;
  int local_fe0;
  int local_fdc;
  int in_stack_fffffffffffff030;
  undefined4 in_stack_fffffffffffff034;
  int local_f9c;
  int local_f98;
  int local_f94;
  undefined1 local_f50 [32];
  int local_f30;
  int local_f2c;
  int local_f28;
  Box *in_stack_fffffffffffff0f0;
  EBCellFlagFab *in_stack_fffffffffffff0f8;
  long local_f00;
  long local_ef8;
  int local_ee8;
  int local_ee4;
  int local_ee0;
  int local_eb8;
  int local_eb4;
  int local_eb0;
  int local_eac;
  long local_e68 [8];
  long *local_e28;
  undefined1 local_e20 [104];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_db8;
  undefined1 local_db0 [200];
  int local_ce8;
  RefID local_ce0;
  int local_cd4;
  int iStack_cd0;
  int local_ccc;
  FabArrayBase *local_cc8;
  int local_cc0;
  unique_ptr<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
  local_cb8;
  int local_cac;
  int iStack_ca8;
  int local_ca4;
  FabArrayBase *local_ca0;
  int local_c98;
  PCData<amrex::FArrayBox> *local_c90;
  int local_c84;
  int iStack_c80;
  int local_c7c;
  pointer local_c78;
  int local_c70;
  PCData<amrex::FArrayBox> *local_c68;
  int local_c5c;
  int iStack_c58;
  int local_c54;
  Long local_c50;
  int local_c48;
  _Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false> local_c40;
  int local_c34;
  int iStack_c30;
  int local_c2c;
  undefined8 local_c28;
  int local_c20;
  PCData<amrex::FArrayBox> *local_c18;
  int local_c0c;
  int iStack_c08;
  int local_c04;
  int local_c00;
  int local_bfc;
  int local_bf8;
  int local_bf4;
  FabArray<amrex::EBCellFlagFab> *local_bf0;
  double local_be8;
  double local_be0;
  double local_bd8;
  undefined1 *local_bd0;
  pointer local_bc8;
  long *local_bc0;
  FabArray<amrex::EBCellFlagFab> *local_bb8;
  int local_bac;
  int local_ba8;
  int local_ba4;
  undefined4 local_ba0;
  int local_b9c;
  int local_b98;
  int local_b94;
  FabArray<amrex::EBCellFlagFab> *local_b90;
  undefined4 local_b88;
  int local_b84;
  int local_b80;
  int local_b7c;
  FabArray<amrex::EBCellFlagFab> *local_b78;
  undefined4 local_b70;
  int local_b6c;
  int local_b68;
  int local_b64;
  FabArray<amrex::EBCellFlagFab> *local_b60;
  double local_b58;
  double local_b50;
  double local_b48;
  double local_b40;
  double local_b38;
  double local_b30;
  double local_b28;
  undefined1 *local_b20;
  Box *local_b18;
  undefined1 *local_b10;
  pointer local_b08;
  long *local_b00;
  FabArray<amrex::EBCellFlagFab> *local_af8;
  int local_aec;
  int local_ae8;
  int local_ae4;
  undefined4 local_ae0;
  int local_adc;
  int local_ad8;
  int local_ad4;
  FabArray<amrex::EBCellFlagFab> *local_ad0;
  undefined4 local_ac8;
  int local_ac4;
  int local_ac0;
  int local_abc;
  FabArray<amrex::EBCellFlagFab> *local_ab8;
  undefined4 local_ab0;
  int local_aac;
  int local_aa8;
  int local_aa4;
  FabArray<amrex::EBCellFlagFab> *local_aa0;
  undefined4 local_a98;
  int local_a94;
  int local_a90;
  int local_a8c;
  FabArray<amrex::EBCellFlagFab> *local_a88;
  undefined4 local_a80;
  int local_a7c;
  int local_a78;
  int local_a74;
  FabArray<amrex::EBCellFlagFab> *local_a70;
  undefined4 local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  FabArray<amrex::EBCellFlagFab> *local_a58;
  undefined4 local_a4c;
  _Atomic_word *local_a48;
  undefined4 local_a3c;
  _Atomic_word *local_a38;
  undefined4 local_a2c;
  _Atomic_word *local_a28;
  undefined4 local_a1c;
  _Atomic_word *local_a18;
  undefined4 local_a0c;
  _Atomic_word *local_a08;
  undefined4 local_9fc;
  _Atomic_word *local_9f8;
  undefined4 local_9ec;
  _Atomic_word *local_9e8;
  undefined4 local_9dc;
  _Atomic_word *local_9d8;
  undefined4 local_9cc;
  _Atomic_word *local_9c8;
  undefined4 local_9bc;
  PCData<amrex::FArrayBox> *local_9b8;
  undefined4 local_9ac;
  PCData<amrex::FArrayBox> *local_9a8;
  undefined4 local_99c;
  PCData<amrex::FArrayBox> *local_998;
  undefined4 local_98c;
  PCData<amrex::FArrayBox> *local_988;
  undefined4 local_97c;
  PCData<amrex::FArrayBox> *local_978;
  undefined4 local_96c;
  PCData<amrex::FArrayBox> *local_968;
  undefined4 local_95c;
  PCData<amrex::FArrayBox> *local_958;
  undefined4 local_94c;
  PCData<amrex::FArrayBox> *local_948;
  undefined4 local_93c;
  PCData<amrex::FArrayBox> *local_938;
  int local_92c;
  int local_928;
  int local_924;
  undefined1 *local_920;
  int local_914;
  int local_910;
  int local_90c;
  long *local_908;
  int local_8fc;
  int local_8f8;
  int local_8f4;
  long *local_8f0;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  long *local_8d8;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  long *local_8c0;
  int local_8b4;
  int local_8b0;
  int local_8ac;
  long *local_8a8;
  int local_89c;
  int local_898;
  int local_894;
  long *local_890;
  int local_884;
  int local_880;
  int local_87c;
  long *local_878;
  int local_86c;
  int local_868;
  int local_864;
  long *local_860;
  int local_854;
  int local_850;
  int local_84c;
  undefined1 *local_848;
  int local_83c;
  int local_838;
  int local_834;
  long *local_830;
  int local_824;
  int local_820;
  int local_81c;
  long *local_818;
  int local_80c;
  int local_808;
  int local_804;
  long *local_800;
  int local_7f4;
  int local_7f0;
  int local_7ec;
  long *local_7e8;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  long *local_7d0;
  int local_7c4;
  int local_7c0;
  int local_7bc;
  long *local_7b8;
  int local_7ac;
  int local_7a8;
  int local_7a4;
  long *local_7a0;
  int local_794;
  int local_790;
  int local_78c;
  long *local_788;
  int local_77c;
  int local_778;
  int local_774;
  undefined1 *local_770;
  int local_764;
  int local_760;
  int local_75c;
  long *local_758;
  int local_74c;
  int local_748;
  int local_744;
  long *local_740;
  int local_734;
  int local_730;
  int local_72c;
  long *local_728;
  int local_71c;
  int local_718;
  int local_714;
  long *local_710;
  int local_704;
  int local_700;
  int local_6fc;
  long *local_6f8;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  long *local_6e0;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  long *local_6c8;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  long *local_6b0;
  int local_6a4;
  int local_6a0;
  int local_69c;
  undefined1 *local_698;
  int local_68c;
  int local_688;
  int local_684;
  long *local_680;
  int local_674;
  int local_670;
  int local_66c;
  long *local_668;
  int local_65c;
  int local_658;
  int local_654;
  long *local_650;
  int local_644;
  int local_640;
  int local_63c;
  long *local_638;
  int local_62c;
  int local_628;
  int local_624;
  long *local_620;
  int local_614;
  int local_610;
  int local_60c;
  long *local_608;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  long *local_5f0;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  long *local_5d8;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  long *local_5c0;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  long *local_5a8;
  int local_59c;
  int local_598;
  int local_594;
  long *local_590;
  int local_584;
  int local_580;
  int local_57c;
  long *local_578;
  int local_56c;
  int local_568;
  int local_564;
  long *local_560;
  int local_554;
  int local_550;
  int local_54c;
  long *local_548;
  int local_53c;
  int local_538;
  int local_534;
  long *local_530;
  int local_524;
  int local_520;
  int local_51c;
  long *local_518;
  int local_50c;
  int local_508;
  int local_504;
  long *local_500;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  long *local_4e8;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  long *local_4d0;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  long *local_4b8;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  long *local_4a0;
  int local_494;
  int local_490;
  int local_48c;
  long *local_488;
  int local_47c;
  int local_478;
  int local_474;
  long *local_470;
  int local_464;
  int local_460;
  int local_45c;
  long *local_458;
  int local_44c;
  int local_448;
  int local_444;
  long *local_440;
  int local_434;
  int local_430;
  int local_42c;
  long *local_428;
  int local_41c;
  int local_418;
  int local_414;
  long *local_410;
  int local_404;
  int local_400;
  int local_3fc;
  long *local_3f8;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  long *local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  long *local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  long *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  long *local_398;
  int local_38c;
  int local_388;
  int local_384;
  undefined1 *local_380;
  int local_374;
  int local_370;
  int local_36c;
  long *local_368;
  int local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_344;
  int local_340;
  int local_33c;
  long *local_338;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  int local_314;
  int local_310;
  int local_30c;
  long *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  long *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  long *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  long *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  long *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  long *local_290;
  int local_284;
  int local_280;
  int local_27c;
  long *local_278;
  int local_26c;
  int local_268;
  int local_264;
  long *local_260;
  int local_254;
  int local_250;
  int local_24c;
  long *local_248;
  int local_23c;
  int local_238;
  int local_234;
  long *local_230;
  int local_224;
  int local_220;
  int local_21c;
  long *local_218;
  int local_20c;
  int local_208;
  int local_204;
  long *local_200;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  long *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  long *local_1d0;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  long *local_1b8;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  long *local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  long *local_188;
  int local_17c;
  int local_178;
  int local_174;
  long *local_170;
  int local_164;
  int local_160;
  int local_15c;
  long *local_158;
  int local_14c;
  int local_148;
  int local_144;
  long *local_140;
  undefined4 local_138;
  int local_134;
  int local_130;
  int local_12c;
  Box *local_128;
  undefined4 local_120;
  int local_11c;
  int local_118;
  int local_114;
  Box *local_110;
  undefined4 local_108;
  int local_104;
  int local_100;
  int local_fc;
  Box *local_f8;
  undefined4 local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  Box *local_e0;
  undefined4 local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  Box *local_c8;
  undefined4 local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  Box *local_b0;
  undefined4 local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  Box *local_98;
  undefined4 local_90;
  int local_8c;
  int local_88;
  int local_84;
  Box *local_80;
  undefined4 local_78;
  int local_74;
  int local_70;
  int local_6c;
  Box *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  undefined4 local_4c;
  undefined1 *local_48;
  undefined4 local_3c;
  undefined1 *local_38;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined4 local_c;
  undefined1 *local_8;
  
  local_db0._152_8_ = (pointer)0xbff0000000000000;
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                       in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  CoordSys::InvCellSizeArray((GpuArray<double,_3U> *)(local_db0 + 0x80),&this_00->super_CoordSys);
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  pFVar4 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)in_stack_ffffffffffffefd0);
  if (pFVar4 == (pointer)0x0) {
    this_01 = (MFIter *)0x0;
  }
  else {
    this_01 = (MFIter *)
              __dynamic_cast(pFVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
  }
  local_db0._120_8_ = this_01;
  if (this_01 == (MFIter *)0x0) {
    fabarray_ = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    fabarray_ = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_ffffffffffffefd0);
  }
  local_db0._112_8_ = fabarray_;
  if ((MFIter *)local_db0._120_8_ == (MFIter *)0x0) {
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffefd0);
  }
  local_db0._104_8_ = p_Var5;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  do_tiling_ = (undefined1)((ulong)p_Var5 >> 0x38);
  local_db0._96_8_ =
       std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                 ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                  in_stack_ffffffffffffefd0);
  TilingIfNotGPU();
  MFIter::MFIter(this_01,&fabarray_->super_FabArrayBase,(bool)do_tiling_);
  while (bVar2 = MFIter::isValid((MFIter *)local_db0), bVar2) {
    mfi_00 = (PCData<amrex::FArrayBox> *)(local_e20 + 0x4c);
    this_02 = (FabArray<amrex::FArrayBox> *)local_db0;
    MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
    in_stack_ffffffffffffefd0 = (FabArray<amrex::EBCellFlagFab> *)local_e20;
    local_db8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mfi_00;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (this_02,(MFIter *)in_stack_ffffffffffffefd0);
    local_e20._64_8_ = in_stack_ffffffffffffefd0;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this_02,(MFIter *)in_stack_ffffffffffffefd0);
    local_c90 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
    local_998 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
    local_99c = 0;
    local_c84 = *(int *)&((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                         &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                           &(local_db8._M_pi)->_vptr__Sp_counted_base)->
                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start)->_M_head_impl;
    local_9a8 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
    local_9ac = 1;
    iStack_c80 = *(int *)((long)&((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                                 &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                   &(local_db8._M_pi)->_vptr__Sp_counted_base)->
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->_M_head_impl + 4);
    local_ca0 = ((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                  &(local_db8._M_pi)->_vptr__Sp_counted_base)->
                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start)->_M_head_impl;
    local_9b8 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
    local_9bc = 2;
    local_c98 = (local_db8._M_pi)->_M_use_count;
    local_c18 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
    local_a28 = &(local_db8._M_pi)->_M_weak_count;
    local_a2c = 0;
    local_c0c = *local_a28;
    local_a38 = &(local_db8._M_pi)->_M_weak_count;
    local_a3c = 1;
    iStack_c08 = *(int *)&local_db8._M_pi[1]._vptr__Sp_counted_base;
    local_c28 = *(undefined8 *)local_a28;
    local_a48 = &(local_db8._M_pi)->_M_weak_count;
    local_a4c = 2;
    local_c20 = *(int *)((long)&local_db8._M_pi[1]._vptr__Sp_counted_base + 4);
    for (local_eac = 0; local_eb0 = local_c98, local_eac < 3; local_eac = local_eac + 1) {
      for (; local_eb4 = iStack_c80, local_eb0 <= local_c20; local_eb0 = local_eb0 + 1) {
        for (; local_eb8 = local_c84, local_eb4 <= iStack_c08; local_eb4 = local_eb4 + 1) {
          for (; local_eb8 <= local_c0c; local_eb8 = local_eb8 + 1) {
            local_bf0 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
            local_bf4 = local_eb8;
            local_bf8 = local_eb4;
            local_bfc = local_eb0;
            local_c00 = local_eac;
            *(undefined8 *)
             (*(long *)local_e20._64_8_ +
             ((long)(local_eb8 - *(int *)(local_e20._64_8_ + 0x20)) +
              (long)(local_eb4 - *(int *)(local_e20._64_8_ + 0x24)) *
              (long)*(FabArrayBase **)&((BoxArray *)(local_e20._64_8_ + 8))->m_bat +
              (long)(local_eb0 - *(int *)(local_e20._64_8_ + 0x28)) *
              *(long *)((IntVect *)(local_e20._64_8_ + 0x10))->vect +
             (long)local_eac * *(long *)(local_e20._64_8_ + 0x18)) * 8) = 0;
          }
        }
      }
    }
    bVar2 = (MFIter *)local_db0._120_8_ == (MFIter *)0x0;
    local_e28 = local_e68;
    local_c7c = local_c98;
    local_c04 = local_c20;
    if ((MFIter *)local_db0._120_8_ != (MFIter *)0x0) {
      FabArray<amrex::EBCellFlagFab>::operator[](in_stack_ffffffffffffefd0,(MFIter *)mfi_00);
      FVar3 = EBCellFlagFab::getType(in_stack_fffffffffffff0f8,in_stack_fffffffffffff0f0);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (this_02,(MFIter *)in_stack_ffffffffffffefd0);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (this_02,(MFIter *)in_stack_ffffffffffffefd0);
      in_stack_fffffffffffff0f0 = (Box *)local_f50;
      if (FVar3 != covered) {
        if (FVar3 == singlevalued) {
          local_cb8._M_t.
          super___uniq_ptr_impl<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>_>
          .super__Head_base<0UL,_amrex::FBData<amrex::EBCellFlagFab>_*,_false>._M_head_impl =
               (__uniq_ptr_data<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>,_true,_true>
                )(__uniq_ptr_data<amrex::FBData<amrex::EBCellFlagFab>,_std::default_delete<amrex::FBData<amrex::EBCellFlagFab>_>,_true,_true>
                  )local_db8._M_pi;
          local_968 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
          local_96c = 0;
          local_cac = *(int *)&((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                               &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                 &(local_db8._M_pi)->_vptr__Sp_counted_base)->
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start)->_M_head_impl;
          local_978 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
          local_97c = 1;
          iStack_ca8 = *(int *)((long)&((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                                       &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                         &(local_db8._M_pi)->_vptr__Sp_counted_base)->
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->_M_head_impl + 4)
          ;
          local_cc8 = ((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                      &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                        &(local_db8._M_pi)->_vptr__Sp_counted_base)->
                       super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_start)->_M_head_impl;
          local_988 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
          local_98c = 2;
          local_cc0 = (local_db8._M_pi)->_M_use_count;
          local_c40._M_head_impl = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
          local_9f8 = &(local_db8._M_pi)->_M_weak_count;
          local_9fc = 0;
          local_c34 = *local_9f8;
          local_a08 = &(local_db8._M_pi)->_M_weak_count;
          local_a0c = 1;
          iStack_c30 = *(int *)&local_db8._M_pi[1]._vptr__Sp_counted_base;
          local_c50 = *(Long *)local_9f8;
          local_a18 = &(local_db8._M_pi)->_M_weak_count;
          local_a1c = 2;
          local_c48 = *(int *)((long)&local_db8._M_pi[1]._vptr__Sp_counted_base + 4);
          for (local_f94 = local_cc0; local_f98 = iStack_ca8, local_ca4 = local_cc0,
              local_c2c = local_c48, local_f94 <= local_c48; local_f94 = local_f94 + 1) {
            for (; local_f9c = local_cac, local_f98 <= iStack_c30; local_f98 = local_f98 + 1) {
              for (; local_f9c <= local_c34; local_f9c = local_f9c + 1) {
                local_ae4 = local_f9c;
                local_ae8 = local_f98;
                local_aec = local_f94;
                local_af8 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
                local_b00 = local_e28;
                local_b08 = (pointer)local_db0._152_8_;
                local_b20 = local_db0 + 0x80;
                local_384 = local_f9c;
                local_388 = local_f98;
                local_38c = local_f94;
                dVar1 = *(double *)
                         ((long)(&(in_stack_fffffffffffff0f8->super_BaseFab<amrex::EBCellFlag>).
                                  domain.smallend + -2) +
                         ((long)(local_f9c - local_ee8) + (local_f98 - local_ee4) * local_f00 +
                         (local_f94 - local_ee0) * local_ef8) * 8);
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  local_398 = local_e28;
                  local_39c = local_f9c;
                  local_3a0 = local_f98;
                  local_3a4 = local_f94;
                  local_3b4 = local_f9c + 1;
                  local_3b0 = local_e28;
                  local_3b8 = local_f98;
                  local_3bc = local_f94;
                  local_3d0 = local_f98 + 1;
                  local_3c8 = local_e28;
                  local_3cc = local_f9c;
                  local_3d4 = local_f94;
                  local_3e4 = local_f9c + 1;
                  local_3e8 = local_f98 + 1;
                  local_3e0 = local_e28;
                  local_3ec = local_f94;
                  local_404 = local_f94 + 1;
                  local_3f8 = local_e28;
                  local_3fc = local_f9c;
                  local_400 = local_f98;
                  local_414 = local_f9c + 1;
                  local_41c = local_f94 + 1;
                  local_410 = local_e28;
                  local_418 = local_f98;
                  local_430 = local_f98 + 1;
                  local_434 = local_f94 + 1;
                  local_428 = local_e28;
                  local_42c = local_f9c;
                  local_444 = local_f9c + 1;
                  local_448 = local_f98 + 1;
                  local_44c = local_f94 + 1;
                  local_440 = local_e28;
                  local_b28 = (((((((-*(double *)
                                       (*local_e28 +
                                       ((long)(local_f9c - (int)local_e28[4]) +
                                        (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                        local_e28[1] +
                                       (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8) +
                                    *(double *)
                                     (*local_e28 +
                                     ((long)(local_3b4 - (int)local_e28[4]) +
                                      (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                      local_e28[1] +
                                     (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                   *(double *)
                                    (*local_e28 +
                                    ((long)(local_f9c - (int)local_e28[4]) +
                                     (long)(local_3d0 - *(int *)((long)local_e28 + 0x24)) *
                                     local_e28[1] +
                                    (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                                  *(double *)
                                   (*local_e28 +
                                   ((long)(local_3e4 - (int)local_e28[4]) +
                                    (long)(local_3e8 - *(int *)((long)local_e28 + 0x24)) *
                                    local_e28[1] +
                                   (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                 *(double *)
                                  (*local_e28 +
                                  ((long)(local_f9c - (int)local_e28[4]) +
                                   (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                   local_e28[1] +
                                  (long)(local_404 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                                *(double *)
                                 (*local_e28 +
                                 ((long)(local_414 - (int)local_e28[4]) +
                                  (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                  local_e28[1] +
                                 (long)(local_41c - (int)local_e28[5]) * local_e28[2]) * 8)) -
                               *(double *)
                                (*local_e28 +
                                ((long)(local_f9c - (int)local_e28[4]) +
                                 (long)(local_430 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_434 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                              *(double *)
                               (*local_e28 +
                               ((long)(local_444 - (int)local_e28[4]) +
                                (long)(local_448 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                               + (long)(local_44c - (int)local_e28[5]) * local_e28[2]) * 8)) * 0.25;
                  local_458 = local_e28;
                  local_45c = local_f9c;
                  local_460 = local_f98;
                  local_464 = local_f94;
                  local_474 = local_f9c + 1;
                  local_470 = local_e28;
                  local_478 = local_f98;
                  local_47c = local_f94;
                  local_490 = local_f98 + 1;
                  local_488 = local_e28;
                  local_48c = local_f9c;
                  local_494 = local_f94;
                  local_4a4 = local_f9c + 1;
                  local_4a8 = local_f98 + 1;
                  local_4a0 = local_e28;
                  local_4ac = local_f94;
                  local_4c4 = local_f94 + 1;
                  local_4b8 = local_e28;
                  local_4bc = local_f9c;
                  local_4c0 = local_f98;
                  local_4d4 = local_f9c + 1;
                  local_4dc = local_f94 + 1;
                  local_4d0 = local_e28;
                  local_4d8 = local_f98;
                  local_4f0 = local_f98 + 1;
                  local_4f4 = local_f94 + 1;
                  local_4e8 = local_e28;
                  local_4ec = local_f9c;
                  local_504 = local_f9c + 1;
                  local_508 = local_f98 + 1;
                  local_50c = local_f94 + 1;
                  local_500 = local_e28;
                  local_b30 = (((((-*(double *)
                                     (*local_e28 +
                                     ((long)(local_f9c - (int)local_e28[4]) +
                                      (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                      local_e28[1] +
                                     (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8) -
                                  *(double *)
                                   (*local_e28 +
                                   ((long)(local_474 - (int)local_e28[4]) +
                                    (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                    local_e28[1] +
                                   (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                                  *(double *)
                                   (*local_e28 +
                                   ((long)(local_f9c - (int)local_e28[4]) +
                                    (long)(local_490 - *(int *)((long)local_e28 + 0x24)) *
                                    local_e28[1] +
                                   (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8) +
                                 *(double *)
                                  (*local_e28 +
                                  ((long)(local_4a4 - (int)local_e28[4]) +
                                   (long)(local_4a8 - *(int *)((long)local_e28 + 0x24)) *
                                   local_e28[1] +
                                  (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                *(double *)
                                 (*local_e28 +
                                 ((long)(local_f9c - (int)local_e28[4]) +
                                  (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                  local_e28[1] +
                                 (long)(local_4c4 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                               *(double *)
                                (*local_e28 +
                                ((long)(local_4d4 - (int)local_e28[4]) +
                                 (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_4dc - (int)local_e28[5]) * local_e28[2]) * 8)) +
                               *(double *)
                                (*local_e28 +
                                ((long)(local_f9c - (int)local_e28[4]) +
                                 (long)(local_4f0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_4f4 - (int)local_e28[5]) * local_e28[2]) * 8) +
                              *(double *)
                               (*local_e28 +
                               ((long)(local_504 - (int)local_e28[4]) +
                                (long)(local_508 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                               + (long)(local_50c - (int)local_e28[5]) * local_e28[2]) * 8)) * 0.25;
                  local_518 = local_e28;
                  local_51c = local_f9c;
                  local_520 = local_f98;
                  local_524 = local_f94;
                  local_534 = local_f9c + 1;
                  local_530 = local_e28;
                  local_538 = local_f98;
                  local_53c = local_f94;
                  local_550 = local_f98 + 1;
                  local_548 = local_e28;
                  local_54c = local_f9c;
                  local_554 = local_f94;
                  local_564 = local_f9c + 1;
                  local_568 = local_f98 + 1;
                  local_560 = local_e28;
                  local_56c = local_f94;
                  local_584 = local_f94 + 1;
                  local_578 = local_e28;
                  local_57c = local_f9c;
                  local_580 = local_f98;
                  local_594 = local_f9c + 1;
                  local_59c = local_f94 + 1;
                  local_590 = local_e28;
                  local_598 = local_f98;
                  local_5b0 = local_f98 + 1;
                  local_5b4 = local_f94 + 1;
                  local_5a8 = local_e28;
                  local_5ac = local_f9c;
                  local_5c4 = local_f9c + 1;
                  local_5c8 = local_f98 + 1;
                  local_5cc = local_f94 + 1;
                  local_5c0 = local_e28;
                  local_b38 = ((((-*(double *)
                                    (*local_e28 +
                                    ((long)(local_f9c - (int)local_e28[4]) +
                                     (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                     local_e28[1] +
                                    (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8) -
                                 *(double *)
                                  (*local_e28 +
                                  ((long)(local_534 - (int)local_e28[4]) +
                                   (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                   local_e28[1] +
                                  (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                *(double *)
                                 (*local_e28 +
                                 ((long)(local_f9c - (int)local_e28[4]) +
                                  (long)(local_550 - *(int *)((long)local_e28 + 0x24)) *
                                  local_e28[1] +
                                 (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                               *(double *)
                                (*local_e28 +
                                ((long)(local_564 - (int)local_e28[4]) +
                                 (long)(local_568 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                               *(double *)
                                (*local_e28 +
                                ((long)(local_f9c - (int)local_e28[4]) +
                                 (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_584 - (int)local_e28[5]) * local_e28[2]) * 8) +
                               *(double *)
                                (*local_e28 +
                                ((long)(local_594 - (int)local_e28[4]) +
                                 (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_59c - (int)local_e28[5]) * local_e28[2]) * 8) +
                               *(double *)
                                (*local_e28 +
                                ((long)(local_f9c - (int)local_e28[4]) +
                                 (long)(local_5b0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_5b4 - (int)local_e28[5]) * local_e28[2]) * 8) +
                              *(double *)
                               (*local_e28 +
                               ((long)(local_5c4 - (int)local_e28[4]) +
                                (long)(local_5c8 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                               + (long)(local_5cc - (int)local_e28[5]) * local_e28[2]) * 8)) * 0.25;
                  local_5dc = local_f9c + 1;
                  local_5e0 = local_f98 + 1;
                  local_5e4 = local_f94 + 1;
                  local_5d8 = local_e28;
                  local_5f8 = local_f98 + 1;
                  local_5fc = local_f94 + 1;
                  local_5f0 = local_e28;
                  local_5f4 = local_f9c;
                  local_60c = local_f9c + 1;
                  local_614 = local_f94 + 1;
                  local_608 = local_e28;
                  local_610 = local_f98;
                  local_62c = local_f94 + 1;
                  local_620 = local_e28;
                  local_624 = local_f9c;
                  local_628 = local_f98;
                  local_63c = local_f9c + 1;
                  local_640 = local_f98 + 1;
                  local_638 = local_e28;
                  local_644 = local_f94;
                  local_658 = local_f98 + 1;
                  local_650 = local_e28;
                  local_654 = local_f9c;
                  local_65c = local_f94;
                  local_66c = local_f9c + 1;
                  local_668 = local_e28;
                  local_670 = local_f98;
                  local_674 = local_f94;
                  local_680 = local_e28;
                  local_684 = local_f9c;
                  local_688 = local_f98;
                  local_68c = local_f94;
                  local_69c = local_f9c;
                  local_6a0 = local_f98;
                  local_6a4 = local_f94;
                  local_b40 = ((((((*(double *)
                                     (*local_e28 +
                                     ((long)(local_5dc - (int)local_e28[4]) +
                                      (long)(local_5e0 - *(int *)((long)local_e28 + 0x24)) *
                                      local_e28[1] +
                                     (long)(local_5e4 - (int)local_e28[5]) * local_e28[2]) * 8) -
                                   *(double *)
                                    (*local_e28 +
                                    ((long)(local_f9c - (int)local_e28[4]) +
                                     (long)(local_5f8 - *(int *)((long)local_e28 + 0x24)) *
                                     local_e28[1] +
                                    (long)(local_5fc - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                  *(double *)
                                   (*local_e28 +
                                   ((long)(local_60c - (int)local_e28[4]) +
                                    (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                    local_e28[1] +
                                   (long)(local_614 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                                  *(double *)
                                   (*local_e28 +
                                   ((long)(local_f9c - (int)local_e28[4]) +
                                    (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                    local_e28[1] +
                                   (long)(local_62c - (int)local_e28[5]) * local_e28[2]) * 8) +
                                 *(double *)
                                  (*local_e28 +
                                  ((long)(local_63c - (int)local_e28[4]) +
                                   (long)(local_640 - *(int *)((long)local_e28 + 0x24)) *
                                   local_e28[1] +
                                  (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                *(double *)
                                 (*local_e28 +
                                 ((long)(local_f9c - (int)local_e28[4]) +
                                  (long)(local_658 - *(int *)((long)local_e28 + 0x24)) *
                                  local_e28[1] +
                                 (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                               *(double *)
                                (*local_e28 +
                                ((long)(local_66c - (int)local_e28[4]) +
                                 (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                              *(double *)
                               (*local_e28 +
                               ((long)(local_f9c - (int)local_e28[4]) +
                                (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                               + (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) /
                              *(double *)
                               ((long)(&(in_stack_fffffffffffff0f8->super_BaseFab<amrex::EBCellFlag>
                                        ).domain.smallend + -2) +
                               ((long)(local_f9c - local_ee8) + (local_f98 - local_ee4) * local_f00
                               + (local_f94 - local_ee0) * local_ef8) * 8);
                  local_6b4 = local_f9c + 1;
                  local_6b8 = local_f98 + 1;
                  local_6bc = local_f94 + 1;
                  local_6b0 = local_e28;
                  local_6d0 = local_f98 + 1;
                  local_6d4 = local_f94 + 1;
                  local_6c8 = local_e28;
                  local_6cc = local_f9c;
                  local_6e4 = local_f9c + 1;
                  local_6ec = local_f94 + 1;
                  local_6e0 = local_e28;
                  local_6e8 = local_f98;
                  local_704 = local_f94 + 1;
                  local_6f8 = local_e28;
                  local_6fc = local_f9c;
                  local_700 = local_f98;
                  local_714 = local_f9c + 1;
                  local_718 = local_f98 + 1;
                  local_710 = local_e28;
                  local_71c = local_f94;
                  local_730 = local_f98 + 1;
                  local_728 = local_e28;
                  local_72c = local_f9c;
                  local_734 = local_f94;
                  local_744 = local_f9c + 1;
                  local_740 = local_e28;
                  local_748 = local_f98;
                  local_74c = local_f94;
                  local_758 = local_e28;
                  local_75c = local_f9c;
                  local_760 = local_f98;
                  local_764 = local_f94;
                  local_774 = local_f9c;
                  local_778 = local_f98;
                  local_77c = local_f94;
                  local_b48 = (((((((*(double *)
                                      (*local_e28 +
                                      ((long)(local_6b4 - (int)local_e28[4]) +
                                       (long)(local_6b8 - *(int *)((long)local_e28 + 0x24)) *
                                       local_e28[1] +
                                      (long)(local_6bc - (int)local_e28[5]) * local_e28[2]) * 8) -
                                    *(double *)
                                     (*local_e28 +
                                     ((long)(local_f9c - (int)local_e28[4]) +
                                      (long)(local_6d0 - *(int *)((long)local_e28 + 0x24)) *
                                      local_e28[1] +
                                     (long)(local_6d4 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                                   *(double *)
                                    (*local_e28 +
                                    ((long)(local_6e4 - (int)local_e28[4]) +
                                     (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                     local_e28[1] +
                                    (long)(local_6ec - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                  *(double *)
                                   (*local_e28 +
                                   ((long)(local_f9c - (int)local_e28[4]) +
                                    (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                    local_e28[1] +
                                   (long)(local_704 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                 *(double *)
                                  (*local_e28 +
                                  ((long)(local_714 - (int)local_e28[4]) +
                                   (long)(local_718 - *(int *)((long)local_e28 + 0x24)) *
                                   local_e28[1] +
                                  (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                                *(double *)
                                 (*local_e28 +
                                 ((long)(local_f9c - (int)local_e28[4]) +
                                  (long)(local_730 - *(int *)((long)local_e28 + 0x24)) *
                                  local_e28[1] +
                                 (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                               *(double *)
                                (*local_e28 +
                                ((long)(local_744 - (int)local_e28[4]) +
                                 (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                              *(double *)
                               (*local_e28 +
                               ((long)(local_f9c - (int)local_e28[4]) +
                                (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                               + (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) /
                              *(double *)
                               ((long)(&(in_stack_fffffffffffff0f8->super_BaseFab<amrex::EBCellFlag>
                                        ).domain.smallend + -2) +
                               ((long)(local_f9c - local_ee8) + (local_f98 - local_ee4) * local_f00
                               + (local_f94 - local_ee0) * local_ef8) * 8);
                  local_78c = local_f9c + 1;
                  local_790 = local_f98 + 1;
                  local_794 = local_f94 + 1;
                  local_788 = local_e28;
                  local_7a8 = local_f98 + 1;
                  local_7ac = local_f94 + 1;
                  local_7a0 = local_e28;
                  local_7a4 = local_f9c;
                  local_7bc = local_f9c + 1;
                  local_7c4 = local_f94 + 1;
                  local_7b8 = local_e28;
                  local_7c0 = local_f98;
                  local_7dc = local_f94 + 1;
                  local_7d0 = local_e28;
                  local_7d4 = local_f9c;
                  local_7d8 = local_f98;
                  local_7ec = local_f9c + 1;
                  local_7f0 = local_f98 + 1;
                  local_7e8 = local_e28;
                  local_7f4 = local_f94;
                  local_808 = local_f98 + 1;
                  local_800 = local_e28;
                  local_804 = local_f9c;
                  local_80c = local_f94;
                  local_81c = local_f9c + 1;
                  local_818 = local_e28;
                  local_820 = local_f98;
                  local_824 = local_f94;
                  local_830 = local_e28;
                  local_834 = local_f9c;
                  local_838 = local_f98;
                  local_83c = local_f94;
                  local_84c = local_f9c;
                  local_850 = local_f98;
                  local_854 = local_f94;
                  local_b50 = ((((((*(double *)
                                     (*local_e28 +
                                     ((long)(local_78c - (int)local_e28[4]) +
                                      (long)(local_790 - *(int *)((long)local_e28 + 0x24)) *
                                      local_e28[1] +
                                     (long)(local_794 - (int)local_e28[5]) * local_e28[2]) * 8) +
                                   *(double *)
                                    (*local_e28 +
                                    ((long)(local_f9c - (int)local_e28[4]) +
                                     (long)(local_7a8 - *(int *)((long)local_e28 + 0x24)) *
                                     local_e28[1] +
                                    (long)(local_7ac - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                  *(double *)
                                   (*local_e28 +
                                   ((long)(local_7bc - (int)local_e28[4]) +
                                    (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                    local_e28[1] +
                                   (long)(local_7c4 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                 *(double *)
                                  (*local_e28 +
                                  ((long)(local_f9c - (int)local_e28[4]) +
                                   (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                   local_e28[1] +
                                  (long)(local_7dc - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                *(double *)
                                 (*local_e28 +
                                 ((long)(local_7ec - (int)local_e28[4]) +
                                  (long)(local_7f0 - *(int *)((long)local_e28 + 0x24)) *
                                  local_e28[1] +
                                 (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                               *(double *)
                                (*local_e28 +
                                ((long)(local_f9c - (int)local_e28[4]) +
                                 (long)(local_808 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                               *(double *)
                                (*local_e28 +
                                ((long)(local_81c - (int)local_e28[4]) +
                                 (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8) +
                              *(double *)
                               (*local_e28 +
                               ((long)(local_f9c - (int)local_e28[4]) +
                                (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                               + (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) /
                              *(double *)
                               ((long)(&(in_stack_fffffffffffff0f8->super_BaseFab<amrex::EBCellFlag>
                                        ).domain.smallend + -2) +
                               ((long)(local_f9c - local_ee8) + (local_f98 - local_ee4) * local_f00
                               + (local_f94 - local_ee0) * local_ef8) * 8);
                  local_864 = local_f9c + 1;
                  local_868 = local_f98 + 1;
                  local_86c = local_f94 + 1;
                  local_860 = local_e28;
                  local_880 = local_f98 + 1;
                  local_884 = local_f94 + 1;
                  local_878 = local_e28;
                  local_87c = local_f9c;
                  local_894 = local_f9c + 1;
                  local_89c = local_f94 + 1;
                  local_890 = local_e28;
                  local_898 = local_f98;
                  local_8b4 = local_f94 + 1;
                  local_8a8 = local_e28;
                  local_8ac = local_f9c;
                  local_8b0 = local_f98;
                  local_8c4 = local_f9c + 1;
                  local_8c8 = local_f98 + 1;
                  local_8c0 = local_e28;
                  local_8cc = local_f94;
                  local_8e0 = local_f98 + 1;
                  local_8d8 = local_e28;
                  local_8dc = local_f9c;
                  local_8e4 = local_f94;
                  local_8f4 = local_f9c + 1;
                  local_8f0 = local_e28;
                  local_8f8 = local_f98;
                  local_8fc = local_f94;
                  local_908 = local_e28;
                  local_90c = local_f9c;
                  local_910 = local_f98;
                  local_914 = local_f94;
                  local_924 = local_f9c;
                  local_928 = local_f98;
                  local_92c = local_f94;
                  local_b58 = ((((((*(double *)
                                     (*local_e28 +
                                     ((long)(local_864 - (int)local_e28[4]) +
                                      (long)(local_868 - *(int *)((long)local_e28 + 0x24)) *
                                      local_e28[1] +
                                     (long)(local_86c - (int)local_e28[5]) * local_e28[2]) * 8) -
                                   *(double *)
                                    (*local_e28 +
                                    ((long)(local_f9c - (int)local_e28[4]) +
                                     (long)(local_880 - *(int *)((long)local_e28 + 0x24)) *
                                     local_e28[1] +
                                    (long)(local_884 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                  *(double *)
                                   (*local_e28 +
                                   ((long)(local_894 - (int)local_e28[4]) +
                                    (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                    local_e28[1] +
                                   (long)(local_89c - (int)local_e28[5]) * local_e28[2]) * 8)) +
                                 *(double *)
                                  (*local_e28 +
                                  ((long)(local_f9c - (int)local_e28[4]) +
                                   (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) *
                                   local_e28[1] +
                                  (long)(local_8b4 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                                *(double *)
                                 (*local_e28 +
                                 ((long)(local_8c4 - (int)local_e28[4]) +
                                  (long)(local_8c8 - *(int *)((long)local_e28 + 0x24)) *
                                  local_e28[1] +
                                 (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                                *(double *)
                                 (*local_e28 +
                                 ((long)(local_f9c - (int)local_e28[4]) +
                                  (long)(local_8e0 - *(int *)((long)local_e28 + 0x24)) *
                                  local_e28[1] +
                                 (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8) +
                               *(double *)
                                (*local_e28 +
                                ((long)(local_8f4 - (int)local_e28[4]) +
                                 (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                                + (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                              *(double *)
                               (*local_e28 +
                               ((long)(local_f9c - (int)local_e28[4]) +
                                (long)(local_f98 - *(int *)((long)local_e28 + 0x24)) * local_e28[1]
                               + (long)(local_f94 - (int)local_e28[5]) * local_e28[2]) * 8)) /
                              *(double *)
                               ((long)(&(in_stack_fffffffffffff0f8->super_BaseFab<amrex::EBCellFlag>
                                        ).domain.smallend + -2) +
                               ((long)(local_f9c - local_ee8) + (local_f98 - local_ee4) * local_f00
                               + (local_f94 - local_ee0) * local_ef8) * 8);
                  local_3c = 0;
                  local_6c = local_f9c;
                  local_70 = local_f98;
                  local_74 = local_f94;
                  local_78 = 1;
                  local_84 = local_f9c;
                  local_88 = local_f98;
                  local_8c = local_f94;
                  local_90 = 2;
                  local_9c = local_f9c;
                  local_a0 = local_f98;
                  local_a4 = local_f94;
                  local_a8 = 8;
                  local_aa0 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
                  local_aa4 = local_f9c;
                  local_aa8 = local_f98;
                  local_aac = local_f94;
                  local_ab0 = 0;
                  lVar6 = (long)(local_f9c - *(int *)(local_e20._64_8_ + 0x20)) +
                          (long)(local_f98 - *(int *)(local_e20._64_8_ + 0x24)) *
                          (long)*(FabArrayBase **)&((BoxArray *)(local_e20._64_8_ + 8))->m_bat +
                          (long)(local_f94 - *(int *)(local_e20._64_8_ + 0x28)) *
                          *(long *)((IntVect *)(local_e20._64_8_ + 0x10))->vect;
                  *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8) =
                       -((double)local_db0._152_8_ * (double)local_db0._128_8_) *
                       (*(double *)
                         (local_f50._0_8_ +
                         ((long)(local_f9c - local_f30) +
                          (long)(local_f98 - local_f2c) * local_f50._8_8_ +
                          (long)(local_f94 - local_f28) * local_f50._16_8_ + local_f50._24_8_ * 8) *
                         8) * local_b58 +
                       *(double *)
                        (local_f50._0_8_ +
                        ((long)(local_f9c - local_f30) +
                         (long)(local_f98 - local_f2c) * local_f50._8_8_ +
                         (long)(local_f94 - local_f28) * local_f50._16_8_ + local_f50._24_8_ * 2) *
                        8) * 0.5 * local_b48 +
                       *(double *)
                        (local_f50._0_8_ +
                        ((long)(local_f9c - local_f30) +
                         (long)(local_f98 - local_f2c) * local_f50._8_8_ +
                         (long)(local_f94 - local_f28) * local_f50._16_8_ + local_f50._24_8_) * 8) *
                       0.5 * local_b40 + local_b28) +
                       *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8);
                  local_4c = 1;
                  local_b4 = local_f9c;
                  local_b8 = local_f98;
                  local_bc = local_f94;
                  local_c0 = 0;
                  local_cc = local_f9c;
                  local_d0 = local_f98;
                  local_d4 = local_f94;
                  local_d8 = 2;
                  local_e4 = local_f9c;
                  local_e8 = local_f98;
                  local_ec = local_f94;
                  local_f0 = 7;
                  local_ab8 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
                  local_abc = local_f9c;
                  local_ac0 = local_f98;
                  local_ac4 = local_f94;
                  local_ac8 = 1;
                  lVar6 = (long)(local_f9c - *(int *)(local_e20._64_8_ + 0x20)) +
                          (long)(local_f98 - *(int *)(local_e20._64_8_ + 0x24)) *
                          (long)*(FabArrayBase **)&((BoxArray *)(local_e20._64_8_ + 8))->m_bat +
                          (long)(local_f94 - *(int *)(local_e20._64_8_ + 0x28)) *
                          *(long *)((IntVect *)(local_e20._64_8_ + 0x10))->vect +
                          *(long *)(local_e20._64_8_ + 0x18);
                  *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8) =
                       -((double)local_db0._152_8_ * (double)local_db0._136_8_) *
                       (*(double *)
                         (local_f50._0_8_ +
                         ((long)(local_f9c - local_f30) +
                          (long)(local_f98 - local_f2c) * local_f50._8_8_ +
                          (long)(local_f94 - local_f28) * local_f50._16_8_ + local_f50._24_8_ * 7) *
                         8) * local_b58 +
                       *(double *)
                        (local_f50._0_8_ +
                        ((long)(local_f9c - local_f30) +
                         (long)(local_f98 - local_f2c) * local_f50._8_8_ +
                         (long)(local_f94 - local_f28) * local_f50._16_8_ + local_f50._24_8_ * 2) *
                        8) * 0.5 * local_b50 +
                       *(double *)
                        (local_f50._0_8_ +
                        ((long)(local_f9c - local_f30) +
                         (long)(local_f98 - local_f2c) * local_f50._8_8_ +
                        (long)(local_f94 - local_f28) * local_f50._16_8_) * 8) * 0.5 * local_b40 +
                       local_b30) + *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8);
                  local_5c = 2;
                  local_fc = local_f9c;
                  local_100 = local_f98;
                  local_104 = local_f94;
                  local_108 = 0;
                  local_114 = local_f9c;
                  local_118 = local_f98;
                  local_11c = local_f94;
                  local_120 = 1;
                  local_12c = local_f9c;
                  local_130 = local_f98;
                  local_134 = local_f94;
                  local_138 = 6;
                  local_ad0 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
                  local_ad4 = local_f9c;
                  local_ad8 = local_f98;
                  local_adc = local_f94;
                  local_ae0 = 2;
                  lVar6 = (long)(local_f9c - *(int *)(local_e20._64_8_ + 0x20)) +
                          (long)(local_f98 - *(int *)(local_e20._64_8_ + 0x24)) *
                          (long)*(FabArrayBase **)&((BoxArray *)(local_e20._64_8_ + 8))->m_bat +
                          (long)(local_f94 - *(int *)(local_e20._64_8_ + 0x28)) *
                          *(long *)((IntVect *)(local_e20._64_8_ + 0x10))->vect +
                          *(long *)(local_e20._64_8_ + 0x18) * 2;
                  *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8) =
                       -((double)local_db0._152_8_ * (double)local_db0._144_8_) *
                       (*(double *)
                         (local_f50._0_8_ +
                         ((long)(local_f9c - local_f30) +
                          (long)(local_f98 - local_f2c) * local_f50._8_8_ +
                          (long)(local_f94 - local_f28) * local_f50._16_8_ + local_f50._24_8_ * 6) *
                         8) * local_b58 +
                       *(double *)
                        (local_f50._0_8_ +
                        ((long)(local_f9c - local_f30) +
                         (long)(local_f98 - local_f2c) * local_f50._8_8_ +
                         (long)(local_f94 - local_f28) * local_f50._16_8_ + local_f50._24_8_) * 8) *
                       0.5 * local_b50 +
                       *(double *)
                        (local_f50._0_8_ +
                        ((long)(local_f9c - local_f30) +
                         (long)(local_f98 - local_f2c) * local_f50._8_8_ +
                        (long)(local_f94 - local_f28) * local_f50._16_8_) * 8) * 0.5 * local_b48 +
                       local_b38) + *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8);
                  local_920 = &stack0xfffffffffffff0f8;
                  local_848 = &stack0xfffffffffffff0f8;
                  local_770 = &stack0xfffffffffffff0f8;
                  local_698 = &stack0xfffffffffffff0f8;
                  local_128 = in_stack_fffffffffffff0f0;
                  local_110 = in_stack_fffffffffffff0f0;
                  local_f8 = in_stack_fffffffffffff0f0;
                  local_e0 = in_stack_fffffffffffff0f0;
                  local_c8 = in_stack_fffffffffffff0f0;
                  local_b0 = in_stack_fffffffffffff0f0;
                  local_98 = in_stack_fffffffffffff0f0;
                  local_80 = in_stack_fffffffffffff0f0;
                  local_68 = in_stack_fffffffffffff0f0;
                  local_58 = local_b20;
                  local_48 = local_b20;
                  local_38 = local_b20;
                }
                else {
                  local_a58 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
                  local_a5c = local_f9c;
                  local_a60 = local_f98;
                  local_a64 = local_f94;
                  local_a68 = 2;
                  *(undefined8 *)
                   (*(long *)local_e20._64_8_ +
                   ((long)(local_f9c - *(int *)(local_e20._64_8_ + 0x20)) +
                    (long)(local_f98 - *(int *)(local_e20._64_8_ + 0x24)) *
                    (long)*(FabArrayBase **)&((BoxArray *)(local_e20._64_8_ + 8))->m_bat +
                    (long)(local_f94 - *(int *)(local_e20._64_8_ + 0x28)) *
                    *(long *)((IntVect *)(local_e20._64_8_ + 0x10))->vect +
                   *(long *)(local_e20._64_8_ + 0x18) * 2) * 8) = 0;
                  local_a70 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
                  local_a74 = local_f9c;
                  local_a78 = local_f98;
                  local_a7c = local_f94;
                  local_a80 = 1;
                  *(undefined8 *)
                   (*(long *)local_e20._64_8_ +
                   ((long)(local_f9c - *(int *)(local_e20._64_8_ + 0x20)) +
                    (long)(local_f98 - *(int *)(local_e20._64_8_ + 0x24)) *
                    (long)*(FabArrayBase **)&((BoxArray *)(local_e20._64_8_ + 8))->m_bat +
                    (long)(local_f94 - *(int *)(local_e20._64_8_ + 0x28)) *
                    *(long *)((IntVect *)(local_e20._64_8_ + 0x10))->vect +
                   *(long *)(local_e20._64_8_ + 0x18)) * 8) = 0;
                  local_a88 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
                  local_a8c = local_f9c;
                  local_a90 = local_f98;
                  local_a94 = local_f94;
                  local_a98 = 0;
                  *(undefined8 *)
                   (*(long *)local_e20._64_8_ +
                   ((long)(local_f9c - *(int *)(local_e20._64_8_ + 0x20)) +
                    (long)(local_f98 - *(int *)(local_e20._64_8_ + 0x24)) *
                    (long)*(FabArrayBase **)&((BoxArray *)(local_e20._64_8_ + 8))->m_bat +
                   (long)(local_f94 - *(int *)(local_e20._64_8_ + 0x28)) *
                   *(long *)((IntVect *)(local_e20._64_8_ + 0x10))->vect) * 8) = 0;
                }
                local_b18 = in_stack_fffffffffffff0f0;
                local_b10 = &stack0xfffffffffffff0f8;
                local_380 = &stack0xfffffffffffff0f8;
              }
            }
          }
        }
        else {
          bVar2 = true;
        }
      }
    }
    if (bVar2) {
      local_ce0.data = (BARef *)local_db8._M_pi;
      local_938 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
      local_93c = 0;
      local_cd4 = *(int *)&((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                           &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                             &(local_db8._M_pi)->_vptr__Sp_counted_base)->
                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start)->_M_head_impl;
      local_948 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
      local_94c = 1;
      iStack_cd0 = *(int *)((long)&((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
                                   &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                     &(local_db8._M_pi)->_vptr__Sp_counted_base)->
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->_M_head_impl + 4);
      local_db0._192_8_ =
           ((_Head_base<0UL,_amrex::FabArrayBase_*,_false> *)
           &(((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
             &(local_db8._M_pi)->_vptr__Sp_counted_base)->
            super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start)->_M_head_impl;
      local_958 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
      local_95c = 2;
      local_ce8 = (local_db8._M_pi)->_M_use_count;
      local_c68 = (PCData<amrex::FArrayBox> *)local_db8._M_pi;
      local_9c8 = &(local_db8._M_pi)->_M_weak_count;
      local_9cc = 0;
      local_c5c = *local_9c8;
      local_9d8 = &(local_db8._M_pi)->_M_weak_count;
      local_9dc = 1;
      iStack_c58 = *(int *)&local_db8._M_pi[1]._vptr__Sp_counted_base;
      local_c78 = *(pointer *)local_9c8;
      local_9e8 = &(local_db8._M_pi)->_M_weak_count;
      local_9ec = 2;
      in_stack_fffffffffffff030 = *(int *)((long)&local_db8._M_pi[1]._vptr__Sp_counted_base + 4);
      for (local_fdc = local_ce8; local_fe0 = iStack_cd0, local_ccc = local_ce8,
          local_c70 = in_stack_fffffffffffff030, local_c54 = in_stack_fffffffffffff030,
          local_fdc <= in_stack_fffffffffffff030; local_fdc = local_fdc + 1) {
        for (; local_fe4 = local_cd4, local_fe0 <= iStack_c58; local_fe0 = local_fe0 + 1) {
          for (; local_fe4 <= local_c5c; local_fe4 = local_fe4 + 1) {
            local_ba4 = local_fe4;
            local_ba8 = local_fe0;
            local_bac = local_fdc;
            local_bb8 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
            local_bc0 = local_e28;
            local_bc8 = (pointer)local_db0._152_8_;
            local_bd0 = local_db0 + 0x80;
            local_c = 0;
            local_bd8 = (double)local_db0._128_8_ * 0.25;
            local_1c = 1;
            local_be0 = (double)local_db0._136_8_ * 0.25;
            local_2c = 2;
            local_be8 = (double)local_db0._144_8_ * 0.25;
            local_140 = local_e28;
            local_144 = local_fe4;
            local_148 = local_fe0;
            local_14c = local_fdc;
            local_158 = local_e28;
            local_15c = local_fe4 + 1;
            local_160 = local_fe0;
            local_164 = local_fdc;
            local_170 = local_e28;
            local_174 = local_fe4;
            local_178 = local_fe0 + 1;
            local_17c = local_fdc;
            local_188 = local_e28;
            local_18c = local_fe4 + 1;
            local_190 = local_fe0 + 1;
            local_194 = local_fdc;
            local_1a0 = local_e28;
            local_1a4 = local_fe4;
            local_1a8 = local_fe0;
            local_1ac = local_fdc + 1;
            local_1b8 = local_e28;
            local_1bc = local_fe4 + 1;
            local_1c0 = local_fe0;
            local_1c4 = local_fdc + 1;
            local_1d0 = local_e28;
            local_1d4 = local_fe4;
            local_1d8 = local_fe0 + 1;
            local_1dc = local_fdc + 1;
            local_1e8 = local_e28;
            local_1ec = local_fe4 + 1;
            local_1f0 = local_fe0 + 1;
            local_1f4 = local_fdc + 1;
            local_b60 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
            local_b64 = local_fe4;
            local_b68 = local_fe0;
            local_b6c = local_fdc;
            local_b70 = 0;
            lVar6 = (long)(local_fe4 - *(int *)(local_e20._64_8_ + 0x20)) +
                    (long)(local_fe0 - *(int *)(local_e20._64_8_ + 0x24)) *
                    (long)*(FabArrayBase **)&((BoxArray *)(local_e20._64_8_ + 8))->m_bat +
                    (long)(local_fdc - *(int *)(local_e20._64_8_ + 0x28)) *
                    *(long *)((IntVect *)(local_e20._64_8_ + 0x10))->vect;
            *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8) =
                 -((double)local_db0._152_8_ * local_bd8) *
                 (((((((-*(double *)
                          (*local_e28 +
                          ((long)(local_fe4 - (int)local_e28[4]) +
                           (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                          (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8) +
                       *(double *)
                        (*local_e28 +
                        ((long)(local_15c - (int)local_e28[4]) +
                         (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                        (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8)) -
                      *(double *)
                       (*local_e28 +
                       ((long)(local_fe4 - (int)local_e28[4]) +
                        (long)(local_178 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                       (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8)) +
                     *(double *)
                      (*local_e28 +
                      ((long)(local_18c - (int)local_e28[4]) +
                       (long)(local_190 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                      (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8)) -
                    *(double *)
                     (*local_e28 +
                     ((long)(local_fe4 - (int)local_e28[4]) +
                      (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                     (long)(local_1ac - (int)local_e28[5]) * local_e28[2]) * 8)) +
                   *(double *)
                    (*local_e28 +
                    ((long)(local_1bc - (int)local_e28[4]) +
                     (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                    (long)(local_1c4 - (int)local_e28[5]) * local_e28[2]) * 8)) -
                  *(double *)
                   (*local_e28 +
                   ((long)(local_fe4 - (int)local_e28[4]) +
                    (long)(local_1d8 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                   (long)(local_1dc - (int)local_e28[5]) * local_e28[2]) * 8)) +
                 *(double *)
                  (*local_e28 +
                  ((long)(local_1ec - (int)local_e28[4]) +
                   (long)(local_1f0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                  (long)(local_1f4 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                 *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8);
            local_200 = local_e28;
            local_204 = local_fe4;
            local_208 = local_fe0;
            local_20c = local_fdc;
            local_218 = local_e28;
            local_21c = local_fe4 + 1;
            local_220 = local_fe0;
            local_224 = local_fdc;
            local_230 = local_e28;
            local_234 = local_fe4;
            local_238 = local_fe0 + 1;
            local_23c = local_fdc;
            local_248 = local_e28;
            local_24c = local_fe4 + 1;
            local_250 = local_fe0 + 1;
            local_254 = local_fdc;
            local_260 = local_e28;
            local_264 = local_fe4;
            local_268 = local_fe0;
            local_26c = local_fdc + 1;
            local_278 = local_e28;
            local_27c = local_fe4 + 1;
            local_280 = local_fe0;
            local_284 = local_fdc + 1;
            local_290 = local_e28;
            local_294 = local_fe4;
            local_298 = local_fe0 + 1;
            local_29c = local_fdc + 1;
            local_2a8 = local_e28;
            local_2ac = local_fe4 + 1;
            local_2b0 = local_fe0 + 1;
            local_2b4 = local_fdc + 1;
            local_b78 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
            local_b7c = local_fe4;
            local_b80 = local_fe0;
            local_b84 = local_fdc;
            local_b88 = 1;
            lVar6 = (long)(local_fe4 - *(int *)(local_e20._64_8_ + 0x20)) +
                    (long)(local_fe0 - *(int *)(local_e20._64_8_ + 0x24)) *
                    (long)*(FabArrayBase **)&((BoxArray *)(local_e20._64_8_ + 8))->m_bat +
                    (long)(local_fdc - *(int *)(local_e20._64_8_ + 0x28)) *
                    *(long *)((IntVect *)(local_e20._64_8_ + 0x10))->vect +
                    *(long *)(local_e20._64_8_ + 0x18);
            *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8) =
                 -((double)local_db0._152_8_ * local_be0) *
                 (((((-*(double *)
                        (*local_e28 +
                        ((long)(local_fe4 - (int)local_e28[4]) +
                         (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                        (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8) -
                     *(double *)
                      (*local_e28 +
                      ((long)(local_21c - (int)local_e28[4]) +
                       (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                      (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8)) +
                     *(double *)
                      (*local_e28 +
                      ((long)(local_fe4 - (int)local_e28[4]) +
                       (long)(local_238 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                      (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8) +
                    *(double *)
                     (*local_e28 +
                     ((long)(local_24c - (int)local_e28[4]) +
                      (long)(local_250 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                     (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8)) -
                   *(double *)
                    (*local_e28 +
                    ((long)(local_fe4 - (int)local_e28[4]) +
                     (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                    (long)(local_26c - (int)local_e28[5]) * local_e28[2]) * 8)) -
                  *(double *)
                   (*local_e28 +
                   ((long)(local_27c - (int)local_e28[4]) +
                    (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                   (long)(local_284 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                  *(double *)
                   (*local_e28 +
                   ((long)(local_fe4 - (int)local_e28[4]) +
                    (long)(local_298 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                   (long)(local_29c - (int)local_e28[5]) * local_e28[2]) * 8) +
                 *(double *)
                  (*local_e28 +
                  ((long)(local_2ac - (int)local_e28[4]) +
                   (long)(local_2b0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                  (long)(local_2b4 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                 *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8);
            local_2c0 = local_e28;
            local_2c4 = local_fe4;
            local_2c8 = local_fe0;
            local_2cc = local_fdc;
            local_2d8 = local_e28;
            local_2dc = local_fe4 + 1;
            local_2e0 = local_fe0;
            local_2e4 = local_fdc;
            local_2f0 = local_e28;
            local_2f4 = local_fe4;
            local_2f8 = local_fe0 + 1;
            local_2fc = local_fdc;
            local_308 = local_e28;
            local_30c = local_fe4 + 1;
            local_310 = local_fe0 + 1;
            local_314 = local_fdc;
            local_320 = local_e28;
            local_324 = local_fe4;
            local_328 = local_fe0;
            local_32c = local_fdc + 1;
            local_338 = local_e28;
            local_33c = local_fe4 + 1;
            local_340 = local_fe0;
            local_344 = local_fdc + 1;
            local_350 = local_e28;
            local_354 = local_fe4;
            local_358 = local_fe0 + 1;
            local_35c = local_fdc + 1;
            local_368 = local_e28;
            local_36c = local_fe4 + 1;
            local_370 = local_fe0 + 1;
            local_374 = local_fdc + 1;
            local_b90 = (FabArray<amrex::EBCellFlagFab> *)local_e20._64_8_;
            local_b94 = local_fe4;
            local_b98 = local_fe0;
            local_b9c = local_fdc;
            local_ba0 = 2;
            lVar6 = (long)(local_fe4 - *(int *)(local_e20._64_8_ + 0x20)) +
                    (long)(local_fe0 - *(int *)(local_e20._64_8_ + 0x24)) *
                    (long)*(FabArrayBase **)&((BoxArray *)(local_e20._64_8_ + 8))->m_bat +
                    (long)(local_fdc - *(int *)(local_e20._64_8_ + 0x28)) *
                    *(long *)((IntVect *)(local_e20._64_8_ + 0x10))->vect +
                    *(long *)(local_e20._64_8_ + 0x18) * 2;
            *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8) =
                 -((double)local_db0._152_8_ * local_be8) *
                 ((((-*(double *)
                       (*local_e28 +
                       ((long)(local_fe4 - (int)local_e28[4]) +
                        (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                       (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8) -
                    *(double *)
                     (*local_e28 +
                     ((long)(local_2dc - (int)local_e28[4]) +
                      (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                     (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8)) -
                   *(double *)
                    (*local_e28 +
                    ((long)(local_fe4 - (int)local_e28[4]) +
                     (long)(local_2f8 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                    (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8)) -
                  *(double *)
                   (*local_e28 +
                   ((long)(local_30c - (int)local_e28[4]) +
                    (long)(local_310 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                   (long)(local_fdc - (int)local_e28[5]) * local_e28[2]) * 8)) +
                  *(double *)
                   (*local_e28 +
                   ((long)(local_fe4 - (int)local_e28[4]) +
                    (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                   (long)(local_32c - (int)local_e28[5]) * local_e28[2]) * 8) +
                  *(double *)
                   (*local_e28 +
                   ((long)(local_33c - (int)local_e28[4]) +
                    (long)(local_fe0 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                   (long)(local_344 - (int)local_e28[5]) * local_e28[2]) * 8) +
                  *(double *)
                   (*local_e28 +
                   ((long)(local_fe4 - (int)local_e28[4]) +
                    (long)(local_358 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                   (long)(local_35c - (int)local_e28[5]) * local_e28[2]) * 8) +
                 *(double *)
                  (*local_e28 +
                  ((long)(local_36c - (int)local_e28[4]) +
                   (long)(local_370 - *(int *)((long)local_e28 + 0x24)) * local_e28[1] +
                  (long)(local_374 - (int)local_e28[5]) * local_e28[2]) * 8)) +
                 *(double *)(*(long *)local_e20._64_8_ + lVar6 * 8);
            local_28 = local_bd0;
            local_18 = local_bd0;
            local_8 = local_bd0;
          }
        }
      }
    }
    MFIter::operator++((MFIter *)local_db0);
  }
  MFIter::~MFIter((MFIter *)in_stack_ffffffffffffefd0);
  return;
}

Assistant:

void
MLNodeLaplacian::compGrad (int amrlev, MultiFab& grad, MultiFab& sol) const
{
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    Real sigma = Real(-1.0);

    AMREX_ASSERT(grad.nComp() >= AMREX_SPACEDIM);

    const auto dxinv = m_geom[amrlev][0].InvCellSizeArray();
#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    const MultiFab* intg = m_integral[amrlev].get();
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(grad, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& garr = grad.array(mfi);
        Array4<Real const> const& solarr = sol.const_array(mfi);

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, AMREX_SPACEDIM, i, j, k, n,
        {
            garr(i,j,k,n) = 0.0;
        });

#ifdef AMREX_USE_EB
        bool regular = !factory;
        if (factory)
        {
            auto type = (*flags)[mfi].getType(bx);
            Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
            Array4<Real const> const& intgarr = intg->const_array(mfi);
            if (type == FabType::covered)
            { }
            else if (type == FabType::singlevalued)
            {
              AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
              {
                  mlndlap_mknewu_eb_c(i,j,k, garr, solarr, sigma, vfracarr, intgarr, dxinv);
              });
            }
            else
            {
                regular = true;
            }
        }
        if (regular)
#endif
        {

#if (AMREX_SPACEDIM == 2)
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_mknewu_c(i,j,k,garr,solarr,sigma,dxinv,is_rz);
            });
#else
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_mknewu_c(i,j,k,garr,solarr,sigma,dxinv);
            });
#endif
        }
    }
}